

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall
Rml::Element::AddAnimationKey
          (Element *this,String *property_name,Property *target_value,float duration,Tween tween)

{
  PropertyId PVar1;
  bool bVar2;
  pointer this_00;
  
  PVar1 = StyleSheetSpecification::GetPropertyId(property_name);
  this_00 = (this->animations).
            super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        (this->animations).
        super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return false;
    }
    if (this_00->property_id == PVar1) break;
    this_00 = this_00 + 1;
  }
  bVar2 = ElementAnimation::AddKey
                    (this_00,duration + this_00->duration,target_value,this,tween,true);
  return bVar2;
}

Assistant:

bool Element::AddAnimationKey(const String& property_name, const Property& target_value, float duration, Tween tween)
{
	ElementAnimation* animation = nullptr;

	PropertyId property_id = StyleSheetSpecification::GetPropertyId(property_name);

	for (auto& existing_animation : animations)
	{
		if (existing_animation.GetPropertyId() == property_id)
		{
			animation = &existing_animation;
			break;
		}
	}
	if (!animation)
		return false;

	bool result = animation->AddKey(animation->GetDuration() + duration, target_value, *this, tween, true);

	return result;
}